

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

char * copy_trunc(char *p,char *str,int maxl,int quote)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  undefined4 extraout_var;
  byte *pbVar6;
  int iVar7;
  
  sVar4 = strlen(str);
  if (quote != 0) {
    *p = '\"';
    p = p + 1;
  }
  pbVar6 = (byte *)(str + sVar4);
  iVar7 = 0;
  if (maxl < 1) {
    maxl = 0;
    iVar7 = 0;
  }
  for (; iVar7 != maxl; iVar7 = iVar7 + 1) {
    bVar1 = *str;
    pcVar5 = (char *)CONCAT71((int7)(sVar4 >> 8),bVar1);
    if (bVar1 < 0x20) goto LAB_00181971;
    uVar2 = fl_utf8len(bVar1);
    sVar4 = CONCAT44(extraout_var,uVar2);
    if (((int)uVar2 < 1) || (pbVar6 < (byte *)str + uVar2)) break;
    while (iVar3 = (int)sVar4, sVar4 = (size_t)(iVar3 - 1), iVar3 != 0) {
      bVar1 = *str;
      str = (char *)((byte *)str + 1);
      *p = bVar1;
      p = (char *)((byte *)p + 1);
    }
  }
  pcVar5 = (char *)CONCAT71((int7)(sVar4 >> 8),*str);
LAB_00181971:
  if ((char)pcVar5 != '\0') {
    ((byte *)p)[0] = 0x2e;
    ((byte *)p)[1] = 0x2e;
    ((byte *)p)[2] = 0x2e;
    ((byte *)p)[3] = 0;
    p = (char *)((byte *)p + 3);
  }
  if (quote != 0) {
    *p = 0x22;
    p = (char *)((byte *)p + 1);
  }
  *p = 0;
  return pcVar5;
}

Assistant:

static char *copy_trunc(char *p, const char *str, int maxl, int quote) {

  int size = 0;				// truncated string size in characters
  int bs;				// size of UTF-8 character in bytes
  const char *end = str + strlen(str);	// end of input string
  if (quote) *p++ = '"';		// opening quote
  while (size < maxl) {			// maximum <maxl> characters
    if (!(*str & (-32))) break;		// end of string (0 or control char)
    bs = fl_utf8len(*str);		// size of next character
    if (bs <= 0) break;			// some error - leave
    if (str + bs > end) break;		// UTF-8 sequence beyond end of string
    while (bs--) *p++ = *str++;		// copy that character into the buffer
    size++;				// count copied characters
  }
  if (*str) {				// string was truncated
    strcpy(p,"..."); p += 3;
  }
  if (quote) *p++ = '"';		// closing quote
  *p = 0;				// terminating null byte
  return p;
}